

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TesterThread::AllocateObject(TesterThread *this)

{
  undefined1 local_28 [8];
  Object object;
  
  object.ptr._0_4_ = TestHarness::Skewed(&(this->rnd_).super_TestHarness,0x10);
  local_28 = (undefined1  [8])AllocatorState::alloc(&this->rnd_,(long)(int)object.ptr);
  if (local_28 != (undefined1  [8])0x0) {
    object.ptr._4_4_ = 0;
    FillContents(this,(Object *)local_28);
    std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::push_back
              (&this->heap_,(Object *)local_28);
    this->heap_size_ = this->heap_size_ + (long)(int)object.ptr;
    return;
  }
  syscall(1,2,"Check failed: object.ptr\n",0x19);
  abort();
}

Assistant:

void AllocateObject() {
    Object object;
    object.size = rnd_.Skewed(FLAGS_lgmaxsize);
    object.ptr = static_cast<char*>(rnd_.alloc(object.size));
    CHECK(object.ptr);
    object.generation = 0;
    FillContents(&object);
    heap_.push_back(object);
    heap_size_ += object.size;
  }